

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O0

int __thiscall CVmObjPageEntry::is_deletable(CVmObjPageEntry *this)

{
  bool local_19;
  bool local_9;
  CVmObjPageEntry *this_local;
  
  local_9 = true;
  if ((*(ushort *)&this->field_0x14 & 1) == 0) {
    local_19 = false;
    if ((*(ushort *)&this->field_0x14 >> 2 & 3) == 0) {
      local_19 = (*(ushort *)&this->field_0x14 >> 4 & 3) == 2;
    }
    local_9 = local_19;
  }
  return (int)local_9;
}

Assistant:

int is_deletable() const
    {
        return (free_
                || (reachable_ == VMOBJ_UNREACHABLE
                    && finalize_state_ == VMOBJ_FINALIZED));
    }